

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void insert_suite::insert_array(void)

{
  type tVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  undefined4 local_26c;
  iterator local_268;
  iterator local_250;
  difference_type local_238 [2];
  int local_228;
  bool local_221;
  nullable local_220 [2];
  size_type local_218 [2];
  basic_variable<std::allocator<char>_> local_208;
  iterator local_1d0;
  undefined4 local_1b4;
  iterator local_1b0;
  iterator local_198;
  difference_type local_180;
  bool local_171;
  nullable local_170 [2];
  size_type local_168 [2];
  basic_variable<std::allocator<char>_> local_158;
  iterator local_120;
  undefined4 local_104;
  iterator local_100;
  iterator local_e8;
  difference_type local_d0 [2];
  nullable local_c0 [2];
  size_type local_b8;
  nullable local_ac;
  basic_variable<std::allocator<char>_> local_a8;
  undefined1 local_78 [8];
  iterator where;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_48[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x249,"void insert_suite::insert_array()",local_48,&local_4c);
  local_ac = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,&local_ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            ((iterator *)local_78,(basic_variable<std::allocator<char>_> *)local_38,&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a8);
  local_b8 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_c0[1] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x24b,"void insert_suite::insert_array()",&local_b8,local_c0 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_c0[0] = null;
  tVar1 = trial::dynamic::operator==(pbVar2,local_c0);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x24c,"void insert_suite::insert_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_e8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_100,(iterator *)local_78);
  local_d0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                          (&local_e8,&local_100);
  local_104 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x24d,"void insert_suite::insert_array()",local_d0,&local_104);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_100);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_158,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (&local_120,(basic_variable<std::allocator<char>_> *)local_38,&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_78,&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  local_168[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_170[1] = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x24f,"void insert_suite::insert_array()",local_168,local_170 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_170[0] = null;
  tVar1 = trial::dynamic::operator==(pbVar2,local_170);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x250,"void insert_suite::insert_array()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,1);
  local_171 = true;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_171);
  boost::detail::test_impl
            ("data[1] == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x251,"void insert_suite::insert_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_198,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1b0,(iterator *)local_78);
  local_180 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_198,&local_1b0);
  local_1b4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x252,"void insert_suite::insert_array()",&local_180,&local_1b4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_208,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (&local_1d0,(basic_variable<std::allocator<char>_> *)local_38,&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_78,&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  local_218[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_220[1] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x254,"void insert_suite::insert_array()",local_218,local_220 + 1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,0);
  local_220[0] = null;
  tVar1 = trial::dynamic::operator==(pbVar2,local_220);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x255,"void insert_suite::insert_array()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,1);
  local_221 = true;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_221);
  boost::detail::test_impl
            ("data[1] == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x256,"void insert_suite::insert_array()",tVar1);
  pbVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,2);
  local_228 = 2;
  tVar1 = trial::dynamic::operator==(pbVar2,&local_228);
  boost::detail::test_impl
            ("data[2] == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,599,"void insert_suite::insert_array()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_250,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_268,(iterator *)local_78);
  local_238[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_250,&local_268);
  local_26c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,600,"void insert_suite::insert_array()",local_238,&local_26c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_250);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void insert_array()
{
    variable data = array::make();
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 0);
    auto where = data.insert(null);
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 1);
    TRIAL_PROTOCOL_TEST(data[0] == null);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    where = data.insert(true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 2);
    TRIAL_PROTOCOL_TEST(data[0] == null);
    TRIAL_PROTOCOL_TEST(data[1] == true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    where = data.insert(2);
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 3);
    TRIAL_PROTOCOL_TEST(data[0] == null);
    TRIAL_PROTOCOL_TEST(data[1] == true);
    TRIAL_PROTOCOL_TEST(data[2] == 2);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
}